

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

bool __thiscall AggressiveBotStrategy::canAttack(AggressiveBotStrategy *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  Country *pCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  bool bVar7;
  Country *pCVar8;
  Country *pCVar9;
  pointer ppCVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  int local_6c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar8 = (Country *)0x0;
  bVar7 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    pvVar3 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    for (ppCVar6 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppCVar6 !=
        (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar6 = ppCVar6 + 1) {
      pCVar4 = *ppCVar6;
      pCVar9 = pCVar4;
      if (pCVar8 != (Country *)0x0) {
        pCVar9 = pCVar8;
        if (*pCVar4->pNumberOfTroops <= *pCVar8->pNumberOfTroops) {
          iVar2 = *pCVar8->cyID;
          p_Var11 = &p_Var1->_M_header;
          for (p_Var12 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var12 != (_Rb_tree_header *)0x0;
              p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < iVar2]) {
            if (iVar2 <= (int)*(size_t *)(p_Var12 + 1)) {
              p_Var11 = p_Var12;
            }
          }
          p_Var12 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var12 = p_Var11, iVar2 < (int)p_Var11[1]._M_color)) {
            p_Var12 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var12 == p_Var1) goto LAB_00119fbc;
        }
        ppCVar10 = (pCVar4->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar5 = (pCVar4->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar10 != ppCVar5) {
          do {
            if (*(*ppCVar10)->pPlayerOwnerId != *pCVar4->pPlayerOwnerId) {
              pCVar8 = pCVar4;
            }
            ppCVar10 = ppCVar10 + 1;
            pCVar9 = pCVar8;
          } while (ppCVar10 != ppCVar5);
        }
      }
LAB_00119fbc:
      pCVar8 = pCVar9;
    }
    ppCVar6 = (pCVar8->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar10 = (pCVar8->pAdjCountries->
               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppCVar6 != ppCVar10) {
      do {
        if (*(*ppCVar6)->pPlayerOwnerId != *pCVar8->pPlayerOwnerId) {
          bVar7 = true;
        }
        ppCVar6 = ppCVar6 + 1;
      } while (ppCVar6 != ppCVar10);
    }
    if (!bVar7) {
      local_6c = *pCVar8->cyID;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_68,&local_6c);
    }
    if (bVar7 != false) {
      pCVar4 = (this->super_PlayerStrategy).from;
      if ((pCVar4 != (Country *)0x0) && (*pCVar8->cyID != *pCVar4->cyID)) {
        bVar7 = false;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_68);
      return bVar7;
    }
  } while( true );
}

Assistant:

bool AggressiveBotStrategy::canAttack() {
    Map::Country* biggest = nullptr;
    bool canAttack = false;
    std::set<int> checkedCountries = std::set<int>();

    while(!canAttack) {
        for (auto* country : *player->getOwnedCountries()) {
            if (biggest == nullptr) {
                biggest = country;
            } else if (biggest->getNumberOfTroops() < country->getNumberOfTroops() ||
                       checkedCountries.find(biggest->getCountryId()) != checkedCountries.end()) {
                for (auto* neighbour : *country->getAdjCountries()) {
                    if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                        biggest = country;
                    }
                }
            }
        }

        for (auto* neighbour: *biggest->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != biggest->getPlayerOwnerID()) {
                canAttack = true;
            }
        }
        if (!canAttack) {
            checkedCountries.insert(biggest->getCountryId());
        }
    }

    if (from != nullptr && biggest->getCountryId() != from->getCountryId()) {
        canAttack = false;
    }
    return canAttack;
}